

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matrix.c
# Opt level: O0

void srecmult(double *A,double *B,double *C,int m,int n,int p,int sA,int sB,int sC)

{
  int rows;
  int cols;
  int cols_00;
  double *B_00;
  double *B_01;
  double *B_02;
  double *C_00;
  double *A_00;
  double *A_01;
  double *A_02;
  double *pdVar1;
  double *pdVar2;
  double *pdVar3;
  int sB1;
  int sA1;
  int sm7;
  int sm6;
  int sm5;
  int sm4;
  int sm3;
  int sm2;
  int sm1;
  double *m7;
  double *m6;
  double *m5;
  double *m4;
  double *m3;
  double *m2;
  double *m1;
  double *c22;
  double *c21;
  double *c12;
  double *c11;
  double *b22;
  double *b21;
  double *b12;
  double *b11;
  double *a22;
  double *a21;
  double *a12;
  double *a11;
  double *B1;
  double *A1;
  double sum;
  int t;
  int v;
  int u;
  int k;
  int j;
  int i;
  int p_local;
  int n_local;
  int m_local;
  double *C_local;
  double *B_local;
  double *A_local;
  
  if (m + n + p < 0xc1) {
    for (k = 0; k < m; k = k + 1) {
      for (u = 0; u < p; u = u + 1) {
        A1 = (double *)0x0;
        for (v = 0; v < n; v = v + 1) {
          A1 = (double *)(A[v + k * sA] * B[u + v * sB] + (double)A1);
        }
        C[u + k * sC] = (double)A1;
      }
    }
  }
  else {
    rows = m / 2;
    cols = n / 2;
    cols_00 = p / 2;
    pdVar3 = A + (long)cols + (long)(rows * sA);
    B_00 = B + (long)cols_00 + (long)(cols * sB);
    B_01 = C + cols_00;
    B_02 = C + rows * sC;
    C_00 = C + (long)cols_00 + (long)(rows * sC);
    A_00 = (double *)malloc((long)rows * 8 * (long)cols_00);
    A_01 = (double *)malloc((long)rows * 8 * (long)cols_00);
    A_02 = (double *)malloc((long)rows * 8 * (long)cols_00);
    pdVar1 = (double *)malloc((long)rows * 8 * (long)cols);
    pdVar2 = (double *)malloc((long)cols * 8 * (long)cols_00);
    madd_stride(A,pdVar3,pdVar1,rows,cols,sA,sA,cols);
    madd_stride(B,B_00,pdVar2,cols,cols_00,sB,sB,cols_00);
    srecmult(pdVar1,pdVar2,A_00,rows,cols,cols_00,cols,cols_00,cols_00);
    free(pdVar1);
    free(pdVar2);
    pdVar1 = (double *)malloc((long)rows * 8 * (long)cols);
    madd_stride(A + rows * sA,pdVar3,pdVar1,rows,cols,sA,sA,cols);
    srecmult(pdVar1,B,B_02,rows,cols,cols_00,cols,sB,sC);
    free(pdVar1);
    pdVar1 = (double *)malloc((long)cols * 8 * (long)cols_00);
    msub_stride(B + cols_00,B_00,pdVar1,cols,cols_00,sB,sB,cols_00);
    srecmult(A,pdVar1,A_01,rows,cols,cols_00,sA,cols_00,cols_00);
    free(pdVar1);
    pdVar1 = (double *)malloc((long)cols * 8 * (long)cols_00);
    msub_stride(B + cols * sB,B,pdVar1,cols,cols_00,sB,sB,cols_00);
    srecmult(pdVar3,pdVar1,A_02,rows,cols,cols_00,sA,cols_00,cols_00);
    free(pdVar1);
    pdVar1 = (double *)malloc((long)rows * 8 * (long)cols);
    madd_stride(A,A + cols,pdVar1,rows,cols,sA,sA,cols);
    srecmult(pdVar1,B_00,B_01,rows,cols,cols_00,cols,sB,sC);
    free(pdVar1);
    pdVar1 = (double *)malloc((long)rows * 8 * (long)cols);
    pdVar2 = (double *)malloc((long)cols * 8 * (long)cols_00);
    msub_stride(A + rows * sA,A,pdVar1,rows,cols,sA,sA,cols);
    madd_stride(B,B + cols_00,pdVar2,cols,cols_00,sB,sB,cols_00);
    srecmult(pdVar1,pdVar2,C_00,rows,cols,cols_00,cols,cols_00,sC);
    free(pdVar1);
    free(pdVar2);
    pdVar1 = (double *)malloc((long)rows * 8 * (long)cols);
    pdVar2 = (double *)malloc((long)cols * 8 * (long)cols_00);
    msub_stride(A + cols,pdVar3,pdVar1,rows,cols,sA,sA,cols);
    madd_stride(B + cols * sB,B_00,pdVar2,cols,cols_00,sB,sB,cols_00);
    srecmult(pdVar1,pdVar2,C,rows,cols,cols_00,cols,cols_00,sC);
    free(pdVar1);
    free(pdVar2);
    pdVar3 = (double *)malloc((long)rows * 8 * (long)cols_00);
    madd_stride(A_00,C,C,rows,cols_00,cols_00,sC,sC);
    msub_stride(A_02,B_01,pdVar3,rows,cols_00,cols_00,sC,cols_00);
    madd_stride(C,pdVar3,C,rows,cols_00,sC,cols_00,sC);
    free(pdVar3);
    pdVar3 = (double *)malloc((long)rows * 8 * (long)cols_00);
    madd_stride(A_00,C_00,C_00,rows,cols_00,cols_00,sC,sC);
    msub_stride(A_01,B_02,pdVar3,rows,cols_00,cols_00,sC,cols_00);
    madd_stride(C_00,pdVar3,C_00,rows,cols_00,sC,cols_00,sC);
    free(pdVar3);
    madd_stride(A_01,B_01,B_01,rows,cols_00,cols_00,sC,sC);
    madd_stride(A_02,B_02,B_02,rows,cols_00,cols_00,sC,sC);
    free(A_00);
    free(A_01);
    free(A_02);
  }
  return;
}

Assistant:

void srecmult(double* A, double* B, double* C,int m,int n, int p,int sA,int sB, int sC) {
	register int i,j,k;
	int u,v,t;
	double sum;
	double *A1,*B1;
	double *a11,*a12,*a21,*a22;
	double *b11,*b12,*b21,*b22;
	double *c11,*c12,*c21,*c22;
	double *m1,*m2,*m3,*m4,*m5,*m6,*m7;
	int sm1,sm2,sm3,sm4,sm5,sm6,sm7;
	int sA1,sB1;
	if (m + n + p <= CUTOFF) {
		for (i = 0; i < m; ++i) {
			for (j = 0; j < p; ++j) {
				v = i * sA;
				u = i * sC;
				t = j + u;
				sum = 0.;
				for (k = 0; k < n;++k) {
					sum += A[k + v] * B[j + k * sB];
				}
				C[t] = sum;
			}
		}

		
	} else {
		m/=2;n/=2;p/=2;
		// A size mXn, C size mXp
		a11 = A;
		a12 = A + n;
		a21 = A + m * sA;
		a22 = A + n + m * sA;
		
		//B size nXp
		
		b11 = B;
		b12 = B + p;
		b21 = B + n * sB;
		b22 = B + p + n * sB;
		
		//C size mXp
		
		c11 = C;
		c12 = C + p;
		c21 = C + m * sC;
		c22 = C + p + m * sC;
		
		// m matrices have dimension m X p each. See http://en.wikipedia.org/wiki/Strassen_algorithm
		
		m1 = (double*) malloc(sizeof(double) *m * p);
		sm1 = p;
		
		m3 = (double*) malloc(sizeof(double) *m * p);
		sm3 = p;
		
		m4 = (double*) malloc(sizeof(double) *m * p);
		sm4 = p;
		
		m2 = c21;
		sm2 = sC;
		
		m5 = c12;
		sm5 = sC;
		
		m6 = c22;
		sm6 = sC;
		
		
		m7 = c11;
		sm7 = sC;
		
		//m1
		
		sA1 = n;
		sB1 = p;
		
		A1 = (double*) malloc(sizeof(double) * m * n);
		B1 = (double*) malloc(sizeof(double) * n * p);
		
		madd_stride(a11,a22,A1,m,n,sA,sA,sA1);
		
		madd_stride(b11,b22,B1,n,p,sB,sB,sB1);
		
		srecmult(A1,B1,m1,m,n,p,sA1,sB1,sm1);
		
		free(A1);
		free(B1);
		
		
		//m2
		
		A1 = (double*) malloc(sizeof(double) * m * n);
		
		madd_stride(a21,a22,A1,m,n,sA,sA,sA1);
				
		srecmult(A1,b11,m2,m,n,p,sA1,sB,sm2);
		
		free(A1);
		
		
		//m3
		
		B1 = (double*) malloc(sizeof(double) * n * p);
		//rmsub_stride(B + p,B + p + n * sC,B1,n,p,m,sC,sC,sC/2);
		msub_stride(b12,b22,B1,n,p,sB,sB,sB1);
		srecmult(a11,B1,m3,m,n,p,sA,sB1,sm3);
		
		free(B1);
		
		//m4
		
		B1 = (double*) malloc(sizeof(double) * n * p);
		//rmsub_stride(B + p,B + p + n * sC,B1,n,p,m,sC,sC,sC/2);
		msub_stride(b21,b11,B1,n,p,sB,sB,sB1);
		srecmult(a22,B1,m4,m,n,p,sA,sB1,sm4);
		
		free(B1);
		
		//m5
		
		A1 = (double*) malloc(sizeof(double) * m * n);
		
		madd_stride(a11,a12,A1,m,n,sA,sA,sA1);
				
		srecmult(A1,b22,m5,m,n,p,sA1,sB,sm5);
		
		free(A1);
		
		
		//m6
		
		A1 = (double*) malloc(sizeof(double) * m * n);
		B1 = (double*) malloc(sizeof(double) * n * p);
		
		msub_stride(a21,a11,A1,m,n,sA,sA,sA1);
		madd_stride(b11,b12,B1,n,p,sB,sB,sB1);
		srecmult(A1,B1,m6,m,n,p,sA1,sB1,sm6);
	
		free(A1);
		free(B1);
		
		//m7
		
		A1 = (double*) malloc(sizeof(double) * m * n);
		B1 = (double*) malloc(sizeof(double) * n * p);
		
		msub_stride(a12,a22,A1,m,n,sA,sA,sA1);
		madd_stride(b21,b22,B1,n,p,sB,sB,sB1);
		srecmult(A1,B1,m7,m,n,p,sA1,sB1,sm7);
	
		free(A1);
		free(B1);
		
		
		// c11
		
		A1 = (double*) malloc(sizeof(double) * m * p);
		sA1 = p;
		madd_stride(m1,m7,m7,m,p,sm1,sm7,sm7);
		msub_stride(m4,m5,A1,m,p,sm4,sm5,sA1);
		madd_stride(m7,A1,m7,m,p,sm7,sA1,sm7);
		
		free(A1);
		
		
		// c22
		
		A1 = (double*) malloc(sizeof(double) * m * p);
		sA1 = p;
		madd_stride(m1,m6,m6,m,p,sm1,sm6,sm6);
		msub_stride(m3,m2,A1,m,p,sm3,sm2,sA1);
		madd_stride(m6,A1,m6,m,p,sm6,sA1,sm6);
		
		free(A1);
		
		//c12 
		
		madd_stride(m3,m5,m5,m,p,sm3,sm5,sm5);
		
		//c21
		
		madd_stride(m4,m2,m2,m,p,sm4,sm2,sm2);
		
		free(m1);
		free(m3);
		free(m4);
	}
}